

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydengine.cpp
# Opt level: O1

void __thiscall HydEngine::HydEngine(HydEngine *this)

{
  this->engineState = CLOSED;
  this->network = (Network *)0x0;
  this->hydSolver = (HydSolver *)0x0;
  *(undefined8 *)((long)&this->hydSolver + 2) = 0;
  *(undefined8 *)((long)&this->matrixSolver + 2) = 0;
  this->startTime = 0;
  this->rptTime = 0;
  this->hydStep = 0;
  this->currentTime = 0;
  this->currentTime = 0;
  this->timeOfDay = 0;
  this->peakKwatts = 0.0;
  (this->timeStepReason)._M_dataplus._M_p = (pointer)&(this->timeStepReason).field_2;
  (this->timeStepReason)._M_string_length = 0;
  (this->timeStepReason).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

HydEngine::HydEngine() :
    engineState(HydEngine::CLOSED),
    network(nullptr),
    hydSolver(nullptr),
    matrixSolver(nullptr),
    saveToFile(false),
    halted(false),
    startTime(0),
    rptTime(0),
    hydStep(0),
    currentTime(0),
    timeOfDay(0),
    peakKwatts(0.0)
{
}